

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O1

int sfd_listener_set_fd(void *arg,void *buf,size_t sz,nni_type t)

{
  int iVar1;
  int iVar2;
  nni_aio *aio;
  int local_2c [2];
  int fd;
  
  iVar2 = nni_copyin_int(local_2c,buf,sz,0,0x7fffffff,t);
  if (iVar2 == 0) {
    nni_mtx_lock((nni_mtx *)((long)arg + 0xb0));
    iVar2 = 7;
    if (*(char *)((long)arg + 0x94) == '\0') {
      iVar1 = *(int *)((long)arg + 0x50);
      iVar2 = 0x16;
      if ((long)iVar1 != 0x10) {
        *(int *)((long)arg + 0x50) = iVar1 + 1;
        *(int *)((long)arg + (long)iVar1 * 4 + 0x54) = local_2c[0];
        aio = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x98));
        iVar2 = 0;
        if (aio != (nni_aio *)0x0) {
          nni_aio_list_remove(aio);
          sfd_start_conn((sfd_listener *)arg,aio);
        }
      }
    }
    nni_mtx_unlock((nni_mtx *)((long)arg + 0xb0));
  }
  return iVar2;
}

Assistant:

static int
sfd_listener_set_fd(void *arg, const void *buf, size_t sz, nni_type t)
{
	sfd_listener *l = arg;
	nni_aio      *aio;
	int           fd;
	int           rv;

	if ((rv = nni_copyin_int(&fd, buf, sz, 0, NNI_MAXINT, t)) != 0) {
		return (rv);
	}

	nni_mtx_lock(&l->mtx);
	if (l->closed) {
		nni_mtx_unlock(&l->mtx);
		return (NNG_ECLOSED);
	}

	if (l->listen_cnt == NNG_SFD_LISTEN_QUEUE) {
		nni_mtx_unlock(&l->mtx);
		return (NNG_ENOSPC);
	}

	l->listen_q[l->listen_cnt++] = fd;

	// if someone was waiting in accept, give it to them now
	if ((aio = nni_list_first(&l->accept_q)) != NULL) {
		nni_aio_list_remove(aio);
		sfd_start_conn(l, aio);
	}

	nni_mtx_unlock(&l->mtx);
	return (0);
}